

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLimits.cpp
# Opt level: O0

void __thiscall
glcts::GeometryShaderMaxUniformBlocksTest::clean(GeometryShaderMaxUniformBlocksTest *this)

{
  code *pcVar1;
  int iVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  reference pvVar6;
  int local_1c;
  GLint i;
  Functions *gl;
  GeometryShaderMaxUniformBlocksTest *this_local;
  long lVar5;
  
  pRVar4 = deqp::Context::getRenderContext
                     ((this->super_GeometryShaderLimitsTransformFeedbackBase).super_TestCaseBase.
                      m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar5 + 0x40))(0x8a11,0);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glBindBuffer() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                  ,0x5a1);
  for (local_1c = 0; local_1c < this->m_max_uniform_blocks; local_1c = local_1c + 1) {
    (**(code **)(lVar5 + 0x48))(0x8a11,local_1c,0);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"glBindBufferBase() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                    ,0x5a8);
    pcVar1 = *(code **)(lVar5 + 0x438);
    pvVar6 = std::
             vector<glcts::GeometryShaderMaxUniformBlocksTest::_uniform_block,_std::allocator<glcts::GeometryShaderMaxUniformBlocksTest::_uniform_block>_>
             ::operator[](&this->m_uniform_blocks,(long)local_1c);
    (*pcVar1)(1,pvVar6);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"glDeleteBuffers() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                    ,0x5ac);
  }
  std::
  vector<glcts::GeometryShaderMaxUniformBlocksTest::_uniform_block,_std::allocator<glcts::GeometryShaderMaxUniformBlocksTest::_uniform_block>_>
  ::clear(&this->m_uniform_blocks);
  return;
}

Assistant:

void GeometryShaderMaxUniformBlocksTest::clean()
{
	/* Retrieve ES entry-points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Bind default to uniform binding point */
	gl.bindBuffer(GL_UNIFORM_BUFFER, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() call failed");

	/* Release buffers */
	for (glw::GLint i = 0; i < m_max_uniform_blocks; ++i)
	{
		/* Bind default to uniform block */
		gl.bindBufferBase(GL_UNIFORM_BUFFER, i, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferBase() call failed");

		/* Delete buffer */
		gl.deleteBuffers(1, &m_uniform_blocks[i].buffer_object_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteBuffers() call failed");
	}

	/* Free memory */
	m_uniform_blocks.clear();
}